

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_redistribution.cpp
# Opt level: O0

void Redistribution::Apply
               (Box *bx,int ncomp,Array4<double> *dUdt_out,Array4<double> *dUdt_in,
               Array4<const_double> *U_in,Array4<double> *scratch,
               Array4<const_amrex::EBCellFlag> *flag,Array4<const_double> *apx,
               Array4<const_double> *apy,Array4<const_double> *apz,Array4<const_double> *vfrac,
               Array4<const_double> *fcx,Array4<const_double> *fcy,Array4<const_double> *fcz,
               Array4<const_double> *ccc,BCRec *d_bcrec_ptr,Geometry *lev_geom,Real dt,
               string *redistribution_type,int srd_max_order,Real target_volfrac,
               Array4<const_double> *srd_update_scale)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  Box *pBVar6;
  Array4<double> *in_RCX;
  void *in_RDX;
  Array4<const_amrex::EBCellFlag> *in_RDI;
  undefined8 *in_R8;
  Array4<double> *in_R9;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  Elixir *in_stack_00000038;
  Geometry *in_stack_00000058;
  undefined4 in_stack_00000068;
  undefined8 *in_stack_00000070;
  Box domain_per_grown;
  Array4<const_double> cent_hat_const;
  Array4<double> cent_hat;
  Elixir eli_chf;
  Array4<const_double> nbhd_vol_const;
  Array4<double> nbhd_vol;
  Elixir eli_nbf;
  Array4<const_double> alpha_const;
  Array4<double> alpha;
  Elixir eli_alpha;
  Array4<const_double> nrs_const;
  Array4<double> nrs;
  Elixir eli_nrs;
  Array4<const_int> itr_const;
  Array4<int> itr;
  Elixir eli_itr;
  FArrayBox cent_hat_fab;
  FArrayBox nbhd_vol_fab;
  FArrayBox alpha_fab;
  FArrayBox nrs_fab;
  IArrayBox itracker;
  Box result_3;
  Box *bxg4;
  Box result_2;
  Box *bxg3;
  Box result_1;
  Box *bxg2;
  Box result;
  Box *bxg1;
  int icomp;
  Array4<double> *in_stack_ffffffffffffea68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffea70;
  Box *in_stack_ffffffffffffea78;
  FArrayBox *in_stack_ffffffffffffea80;
  Box *in_stack_ffffffffffffea88;
  IArrayBox *in_stack_ffffffffffffea90;
  BaseFab<double> *in_stack_ffffffffffffea98;
  anon_class_264_5_2963d9c2 *in_stack_ffffffffffffeab0;
  anon_class_392_7_bf467b72 *f;
  undefined8 in_stack_ffffffffffffeab8;
  int iVar7;
  undefined4 in_stack_ffffffffffffeac0;
  undefined4 in_stack_ffffffffffffeac4;
  undefined1 local_1450 [64];
  undefined1 auStack_1410 [64];
  undefined1 local_13d0 [64];
  undefined1 auStack_1390 [64];
  undefined1 auStack_1350 [64];
  undefined1 auStack_1310 [64];
  undefined1 auStack_12d0 [64];
  undefined8 local_1290;
  undefined1 auStack_1288 [64];
  Array4<const_int> local_1248;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined4 uStack_11e0;
  undefined4 local_11dc;
  undefined4 uStack_11d8;
  undefined8 uStack_11d4;
  double *local_11c8;
  Long LStack_11c0;
  Long local_11b8;
  Long LStack_11b0;
  undefined8 uStack_11a8;
  undefined4 uStack_11a0;
  undefined4 local_119c;
  undefined4 uStack_1198;
  undefined8 uStack_1194;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined4 uStack_1160;
  undefined4 local_115c;
  undefined4 uStack_1158;
  undefined8 uStack_1154;
  undefined8 local_1148;
  double *local_1140;
  Long LStack_1138;
  Long local_1130;
  Long LStack_1128;
  undefined8 uStack_1120;
  undefined4 uStack_1118;
  undefined4 local_1114;
  undefined4 uStack_1110;
  undefined8 uStack_110c;
  undefined8 local_10d8;
  undefined8 local_10d0;
  undefined8 local_10c8;
  uint local_10c0;
  undefined1 auStack_10b8 [24];
  int in_stack_ffffffffffffef60;
  int in_stack_ffffffffffffef64;
  Array4<const_double> *in_stack_ffffffffffffef68;
  Array4<const_double> *in_stack_ffffffffffffef70;
  Array4<double> *in_stack_ffffffffffffef78;
  Array4<const_double> *in_stack_ffffffffffffef80;
  undefined4 in_stack_ffffffffffffef88;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  IndexType IVar14;
  Geometry *in_stack_ffffffffffffefc0;
  Array4<double> local_1018;
  Array4<const_double> local_fc0;
  Array4<double> local_f80;
  Array4<const_double> local_f28;
  Array4<double> local_ee8;
  Array4<const_double> local_e90;
  Array4<double> local_e50;
  Array4<const_int> local_df8;
  Array4<int> local_db8;
  double *local_d50;
  undefined1 auStack_d48 [12];
  int iStack_d3c;
  int local_d38;
  int iStack_d34;
  int local_d2c;
  Array4<const_double> *local_d08;
  Geometry GStack_d00;
  undefined1 local_c30 [24];
  undefined1 auStack_c18 [12];
  IndexType IStack_c0c;
  int local_c08;
  int iStack_c04;
  int local_bfc;
  EBCellFlag *local_be8;
  int iStack_be0;
  int local_bdc;
  int iStack_bd8;
  undefined8 uStack_bd4;
  Box *local_bc0;
  EBCellFlag *local_bb8;
  int iStack_bb0;
  int local_bac;
  int iStack_ba8;
  undefined8 uStack_ba4;
  Box *local_b90;
  EBCellFlag *local_b88;
  int iStack_b80;
  int local_b7c;
  int iStack_b78;
  undefined8 uStack_b74;
  Box *local_b60;
  EBCellFlag *local_b58;
  int iStack_b50;
  int local_b4c;
  int iStack_b48;
  undefined8 uStack_b44;
  Box *local_b30;
  Array4<const_double> local_b28;
  Array4<const_double> local_ae8;
  undefined4 local_aa4;
  undefined1 local_aa0 [72];
  undefined8 local_a58;
  Array4<double> *local_a50;
  undefined8 *local_a48;
  Array4<double> *local_a40;
  void *local_a38;
  Array4<const_amrex::EBCellFlag> *local_a28;
  undefined4 local_a1c;
  Array4<const_amrex::EBCellFlag> *local_a18;
  undefined4 local_a0c;
  Array4<const_amrex::EBCellFlag> *local_a08;
  undefined4 in_stack_fffffffffffff600;
  undefined4 uVar15;
  Array4<const_amrex::EBCellFlag> *flag_00;
  undefined4 in_stack_fffffffffffff610;
  undefined4 uVar16;
  Array4<const_amrex::EBCellFlag> *U_out;
  int ncomp_00;
  Box *bx_00;
  Dim3 local_978 [2];
  Dim3 local_958;
  IndexType *local_948;
  IndexType *local_928;
  undefined4 local_914;
  IndexType *local_910;
  undefined4 local_904;
  IndexType *local_900;
  undefined4 local_8f4;
  IndexType *local_8f0;
  Dim3 local_8e8;
  IndexType *local_8d8;
  int local_8d0;
  int iStack_8cc;
  int local_8c8;
  undefined4 local_8c4;
  IndexType *local_8c0;
  undefined4 local_8b4;
  IndexType *local_8b0;
  undefined4 local_8a4;
  Array4<const_double> *fcx_00;
  Array4<const_double> *fcy_00;
  undefined4 in_stack_fffffffffffff774;
  Array4<const_double> *ccent;
  int iVar17;
  undefined4 in_stack_fffffffffffff784;
  Array4<const_double> *itracker_00;
  int iVar18;
  undefined4 in_stack_fffffffffffff794;
  Array4<const_double> *alpha_00;
  int iVar19;
  int iVar20;
  Array4<const_double> *cent_hat_00;
  Geometry *lev_geom_00;
  int max_order;
  Array4<const_double> *pAVar21;
  Dim3 local_798 [2];
  Dim3 local_778;
  GpuArray<float,_3U> *local_768;
  GpuArray<float,_3U> *local_748;
  undefined4 local_734;
  GpuArray<float,_3U> *local_730;
  undefined4 local_724;
  GpuArray<float,_3U> *local_720;
  undefined4 local_714;
  GpuArray<float,_3U> *local_710;
  Dim3 local_708;
  GpuArray<float,_3U> *local_6f8;
  int local_6f0;
  int iStack_6ec;
  int local_6e8;
  undefined4 local_6e4;
  Box *local_6e0;
  undefined4 local_6d4;
  Box *local_6d0;
  undefined4 local_6c4;
  Box *local_6c0;
  Dim3 local_6b8;
  Dim3 local_6a8 [2];
  undefined4 in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff974;
  Array4<const_double> *in_stack_fffffffffffff978;
  int in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff984;
  Array4<double> *local_5b8;
  int local_5b0;
  int iVar22;
  undefined4 in_stack_fffffffffffffa64;
  Array4<const_amrex::EBCellFlag> *nrs_00;
  int iVar23;
  int iVar24;
  Geometry *ccent_00;
  Array4<const_amrex::EBCellFlag> *flag_01;
  int iVar25;
  undefined4 in_stack_fffffffffffffa94;
  Geometry *alpha_01;
  Array4<double> *nbhd_vol_00;
  int iVar26;
  undefined4 in_stack_fffffffffffffae4;
  Geometry *lev_geom_01;
  Dim3 local_4c8 [2];
  Dim3 local_4a8;
  undefined1 *local_498;
  undefined1 *local_478;
  undefined4 local_464;
  undefined1 *local_460;
  undefined4 local_454;
  undefined1 *local_450;
  undefined4 local_444;
  undefined1 *local_440;
  Dim3 local_438;
  undefined1 *local_428;
  int local_420;
  int iStack_41c;
  int local_418;
  undefined4 local_414;
  int *local_410;
  undefined4 local_404;
  int *local_400;
  undefined4 local_3f4;
  int *local_3f0;
  Dim3 local_3e8;
  Dim3 local_3d8 [2];
  Dim3 local_3b8;
  GpuArray<float,_3U> *local_3a8;
  GpuArray<float,_3U> *local_388;
  undefined4 local_374;
  GpuArray<float,_3U> *local_370;
  undefined4 local_364;
  GpuArray<float,_3U> *local_360;
  undefined4 local_354;
  GpuArray<float,_3U> *local_350;
  Dim3 local_348;
  GpuArray<float,_3U> *local_338;
  int local_330;
  int iStack_32c;
  int local_328;
  undefined4 local_324;
  Box *local_320;
  undefined4 local_314;
  Box *local_310;
  undefined4 local_304;
  Box *local_300;
  Dim3 local_2f8;
  Dim3 local_2e8 [2];
  Dim3 local_2c8;
  Real *local_2b8;
  Real *local_298;
  undefined4 local_284;
  Real *local_280;
  undefined4 local_274;
  Real *local_270;
  undefined4 local_264;
  Real *local_260;
  Dim3 local_258;
  Real *local_248;
  int local_240;
  int iStack_23c;
  int local_238;
  undefined4 local_234;
  undefined1 *local_230;
  undefined4 local_224;
  undefined1 *local_220;
  undefined4 local_214;
  undefined1 *local_210;
  Dim3 local_208;
  Dim3 local_1f8 [2];
  Dim3 local_1d8;
  Geometry *local_1c8;
  Geometry *local_1a8;
  undefined4 local_194;
  Geometry *local_190;
  undefined4 local_184;
  Geometry *local_180;
  undefined4 local_174;
  Geometry *local_170;
  Dim3 local_168;
  Geometry *local_158;
  int local_150;
  int iStack_14c;
  int local_148;
  undefined4 local_144;
  undefined1 *local_140;
  undefined4 local_134;
  undefined1 *local_130;
  undefined4 local_124;
  undefined1 *local_120;
  Dim3 local_118;
  Dim3 local_104 [2];
  Dim3 local_e8;
  undefined1 *local_d8;
  undefined1 *local_b8;
  undefined4 local_a4;
  undefined1 *local_a0;
  undefined4 local_94;
  undefined1 *local_90;
  undefined4 local_84;
  undefined1 *local_80;
  Dim3 local_78;
  undefined1 *local_68;
  int local_60;
  int iStack_5c;
  int local_58;
  undefined4 local_54;
  int *local_50;
  undefined4 local_44;
  int *local_40;
  undefined4 local_34;
  int *local_30;
  
  iVar7 = (int)((ulong)in_stack_ffffffffffffeab8 >> 0x20);
  local_a58 = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_a50 = in_R9;
  local_a48 = in_R8;
  local_a40 = in_RCX;
  local_a38 = in_RDX;
  local_a28 = in_RDI;
  memcpy(local_aa0,in_RDX,0x3c);
  amrex::
  ParallelFor<int,Redistribution::Apply(amrex::Box_const&,int,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::BCRec_const*,amrex::Geometry_const&,double,std::__cxx11::string,int,double,amrex::Array4<double_const>const&)::__0,void>
            ((Box *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar7,
             (anon_class_64_1_bd877c4e *)in_stack_ffffffffffffeab0);
  bVar4 = std::operator==(in_stack_ffffffffffffea70,(char *)in_stack_ffffffffffffea68);
  if (bVar4) {
    local_aa4 = 0;
    amrex::Array4<const_double>::Array4<const_double,_0>(&local_ae8,local_a40);
    amrex::Array4<const_double>::Array4<const_double,_0>(&local_b28,local_a50);
    amrex::apply_flux_redistribution
              ((Box *)in_stack_ffffffffffffef80,in_stack_ffffffffffffef78,in_stack_ffffffffffffef70,
               in_stack_ffffffffffffef68,in_stack_ffffffffffffef64,in_stack_ffffffffffffef60,
               (Array4<const_amrex::EBCellFlag> *)
               CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
               in_stack_fffffffffffff978,
               (Geometry *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
  }
  else {
    bVar4 = std::operator==(in_stack_ffffffffffffea70,(char *)in_stack_ffffffffffffea68);
    if (bVar4) {
      uVar16 = 1;
      local_b58 = local_a28->p;
      uStack_b44 = *(undefined8 *)((long)&local_a28->kstride + 4);
      iStack_b48 = (int)((ulong)*(undefined8 *)((long)&local_a28->jstride + 4) >> 0x20);
      iStack_b50 = (int)local_a28->jstride;
      local_b4c = (int)((ulong)local_a28->jstride >> 0x20);
      U_out = local_a28;
      amrex::Box::grow((Box *)&local_b58,1);
      uVar15 = 2;
      local_b88 = local_a28->p;
      uStack_b74 = *(undefined8 *)((long)&local_a28->kstride + 4);
      iStack_b78 = (int)((ulong)*(undefined8 *)((long)&local_a28->jstride + 4) >> 0x20);
      iStack_b80 = (int)local_a28->jstride;
      local_b7c = (int)((ulong)local_a28->jstride >> 0x20);
      local_b30 = (Box *)&local_b58;
      flag_00 = local_a28;
      amrex::Box::grow((Box *)&local_b88,2);
      local_a08 = local_a28;
      local_a0c = 3;
      local_bb8 = local_a28->p;
      uStack_ba4 = *(undefined8 *)((long)&local_a28->kstride + 4);
      iStack_ba8 = (int)((ulong)*(undefined8 *)((long)&local_a28->jstride + 4) >> 0x20);
      iStack_bb0 = (int)local_a28->jstride;
      local_bac = (int)((ulong)local_a28->jstride >> 0x20);
      local_b60 = (Box *)&local_b88;
      amrex::Box::grow((Box *)&local_bb8,3);
      local_a18 = local_a28;
      local_a1c = 4;
      local_be8 = local_a28->p;
      uStack_bd4 = *(undefined8 *)((long)&local_a28->kstride + 4);
      iStack_bd8 = (int)((ulong)*(undefined8 *)((long)&local_a28->jstride + 4) >> 0x20);
      iStack_be0 = (int)local_a28->jstride;
      local_bdc = (int)((ulong)local_a28->jstride >> 0x20);
      local_b90 = (Box *)&local_bb8;
      amrex::Box::grow((Box *)&local_be8,4);
      local_bc0 = (Box *)&local_be8;
      amrex::IArrayBox::IArrayBox
                (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,
                 (int)((ulong)in_stack_ffffffffffffea80 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffea80 >> 0x18,0),
                 SUB81((ulong)in_stack_ffffffffffffea80 >> 0x10,0),
                 (Arena *)in_stack_ffffffffffffea78);
      amrex::FArrayBox::FArrayBox
                (in_stack_ffffffffffffea80,in_stack_ffffffffffffea78,
                 (int)((ulong)in_stack_ffffffffffffea70 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffea70 >> 0x18,0),
                 SUB81((ulong)in_stack_ffffffffffffea70 >> 0x10,0),
                 (Arena *)in_stack_ffffffffffffea68);
      amrex::FArrayBox::FArrayBox
                (in_stack_ffffffffffffea80,in_stack_ffffffffffffea78,
                 (int)((ulong)in_stack_ffffffffffffea70 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffea70 >> 0x18,0),
                 SUB81((ulong)in_stack_ffffffffffffea70 >> 0x10,0),
                 (Arena *)in_stack_ffffffffffffea68);
      amrex::FArrayBox::FArrayBox
                (in_stack_ffffffffffffea80,in_stack_ffffffffffffea78,
                 (int)((ulong)in_stack_ffffffffffffea70 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffea70 >> 0x18,0),
                 SUB81((ulong)in_stack_ffffffffffffea70 >> 0x10,0),
                 (Arena *)in_stack_ffffffffffffea68);
      amrex::FArrayBox::FArrayBox
                (in_stack_ffffffffffffea80,in_stack_ffffffffffffea78,
                 (int)((ulong)in_stack_ffffffffffffea70 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffea70 >> 0x18,0),
                 SUB81((ulong)in_stack_ffffffffffffea70 >> 0x10,0),
                 (Arena *)in_stack_ffffffffffffea68);
      bx_00 = (Box *)local_c30;
      amrex::BaseFab<int>::elixir<int,_0>((BaseFab<int> *)in_stack_ffffffffffffea98);
      local_948 = (IndexType *)auStack_c18;
      local_8f4 = 0;
      local_904 = 1;
      local_914 = 2;
      fcx_00 = (Array4<const_double> *)&IStack_c0c;
      local_8a4 = 0;
      local_8d0 = IStack_c0c.itype + 1;
      local_8b0 = &IStack_c0c;
      local_8b4 = 1;
      iStack_8cc = local_c08 + 1;
      local_8c0 = &IStack_c0c;
      local_8c4 = 2;
      local_978[0].z = iStack_c04 + 1;
      local_978[0].y = iStack_8cc;
      local_978[0].x = local_8d0;
      pBVar6 = bx_00;
      local_928 = local_948;
      local_910 = local_948;
      local_900 = local_948;
      local_8f0 = local_948;
      local_8e8._0_8_ = local_978[0]._0_8_;
      local_8e8.z = local_978[0].z;
      local_8d8 = local_948;
      local_8c8 = local_978[0].z;
      amrex::Array4<int>::Array4(&local_db8,(int *)local_c30._16_8_,&local_958,local_978,local_bfc);
      ncomp_00 = (int)((ulong)pBVar6 >> 0x20);
      cent_hat_00 = (Array4<const_double> *)auStack_c18;
      itracker_00 = (Array4<const_double> *)CONCAT44(auStack_c18._4_4_,auStack_c18._0_4_);
      iVar5 = iStack_c04 + 1;
      fcy_00 = (Array4<const_double> *)CONCAT44(local_c08 + 1,IStack_c0c.itype + 1);
      ccent = fcy_00;
      iVar17 = iVar5;
      iVar18 = auStack_c18._8_4_;
      alpha_00 = itracker_00;
      iVar19 = auStack_c18._8_4_;
      iVar20 = local_bfc;
      lev_geom_00 = (Geometry *)local_c30._16_8_;
      pAVar21 = itracker_00;
      amrex::Array4<const_int>::Array4
                (&local_df8,(int *)local_c30._16_8_,(Dim3 *)&stack0xfffffffffffff798,
                 (Dim3 *)&stack0xfffffffffffff778,local_bfc);
      max_order = (int)pAVar21;
      amrex::BaseFab<double>::elixir<double,_0>(in_stack_ffffffffffffea98);
      local_768 = &GStack_d00.roundoff_hi_f;
      local_714 = 0;
      local_724 = 1;
      local_734 = 2;
      local_6c0 = &GStack_d00.domain;
      local_6c4 = 0;
      local_6f0 = GStack_d00.domain.smallend.vect[0] + 1;
      local_6d0 = &GStack_d00.domain;
      local_6d4 = 1;
      iStack_6ec = GStack_d00.domain.smallend.vect[1] + 1;
      local_6e0 = &GStack_d00.domain;
      local_6e4 = 2;
      local_798[0].z = GStack_d00.domain.smallend.vect[2] + 1;
      local_798[0].y = iStack_6ec;
      local_798[0].x = local_6f0;
      local_748 = local_768;
      local_730 = local_768;
      local_720 = local_768;
      local_710 = local_768;
      local_708._0_8_ = local_798[0]._0_8_;
      local_708.z = local_798[0].z;
      local_6f8 = local_768;
      local_6e8 = local_798[0].z;
      amrex::Array4<double>::Array4
                (&local_e50,(double *)GStack_d00.roundoff_hi_d.arr[2],&local_778,local_798,
                 GStack_d00.domain.bigend.vect[1]);
      local_3a8 = &GStack_d00.roundoff_hi_f;
      local_354 = 0;
      local_364 = 1;
      local_374 = 2;
      local_300 = &GStack_d00.domain;
      local_304 = 0;
      local_330 = GStack_d00.domain.smallend.vect[0] + 1;
      local_310 = &GStack_d00.domain;
      local_314 = 1;
      iStack_32c = GStack_d00.domain.smallend.vect[1] + 1;
      local_320 = &GStack_d00.domain;
      local_324 = 2;
      local_3e8.z = GStack_d00.domain.smallend.vect[2] + 1;
      local_3e8.y = iStack_32c;
      local_3e8.x = local_330;
      local_3d8[0]._0_8_ = local_3e8._0_8_;
      local_3d8[0].z = local_3e8.z;
      local_388 = local_3a8;
      local_370 = local_3a8;
      local_360 = local_3a8;
      local_350 = local_3a8;
      local_348._0_8_ = local_3e8._0_8_;
      local_348.z = local_3e8.z;
      local_338 = local_3a8;
      local_328 = local_3e8.z;
      amrex::Array4<const_double>::Array4
                (&local_e90,(double *)GStack_d00.roundoff_hi_d.arr[2],&local_3b8,local_3d8,
                 GStack_d00.domain.bigend.vect[1]);
      amrex::BaseFab<double>::elixir<double,_0>(in_stack_ffffffffffffea98);
      local_6b8.z = GStack_d00.prob_domain.xlo[0]._4_4_ + 1;
      local_6b8.y = GStack_d00.prob_domain.xlo[0]._0_4_ + 1;
      local_6b8.x = GStack_d00.super_CoordSys._84_4_ + 1;
      local_6a8[0]._0_8_ = local_6b8._0_8_;
      local_6a8[0].z = local_6b8.z;
      amrex::Array4<double>::Array4
                (&local_ee8,(double *)GStack_d00.super_CoordSys.inv_dx[1],
                 (Dim3 *)&stack0xfffffffffffff978,local_6a8,GStack_d00.prob_domain.xlo[1]._4_4_);
      local_2b8 = GStack_d00.super_CoordSys.inv_dx + 2;
      local_264 = 0;
      local_274 = 1;
      local_284 = 2;
      local_210 = &GStack_d00.super_CoordSys.field_0x54;
      local_214 = 0;
      local_240 = GStack_d00.super_CoordSys._84_4_ + 1;
      local_220 = &GStack_d00.super_CoordSys.field_0x54;
      local_224 = 1;
      iStack_23c = GStack_d00.prob_domain.xlo[0]._0_4_ + 1;
      local_230 = &GStack_d00.super_CoordSys.field_0x54;
      local_234 = 2;
      local_2f8.z = GStack_d00.prob_domain.xlo[0]._4_4_ + 1;
      local_2f8.y = iStack_23c;
      local_2f8.x = local_240;
      local_2e8[0]._0_8_ = local_2f8._0_8_;
      local_2e8[0].z = local_2f8.z;
      local_298 = local_2b8;
      local_280 = local_2b8;
      local_270 = local_2b8;
      local_260 = local_2b8;
      local_258._0_8_ = local_2f8._0_8_;
      local_258.z = local_2f8.z;
      local_248 = local_2b8;
      local_238 = local_2f8.z;
      amrex::Array4<const_double>::Array4
                (&local_f28,(double *)GStack_d00.super_CoordSys.inv_dx[1],&local_2c8,local_2e8,
                 GStack_d00.prob_domain.xlo[1]._4_4_);
      amrex::BaseFab<double>::elixir<double,_0>(in_stack_ffffffffffffea98);
      ccent_00 = &GStack_d00;
      nrs_00 = (Array4<const_amrex::EBCellFlag> *)
               CONCAT44(GStack_d00.super_CoordSys._4_4_,GStack_d00.super_CoordSys.c_sys);
      local_5b0 = GStack_d00.super_CoordSys.offset[1]._4_4_ + 1;
      local_5b8 = (Array4<double> *)
                  CONCAT44(GStack_d00.super_CoordSys.offset[1]._0_4_ + 1,
                           GStack_d00.super_CoordSys.offset[0]._4_4_ + 1);
      iVar22 = GStack_d00.super_CoordSys.offset[0]._0_4_;
      iVar23 = GStack_d00.super_CoordSys.offset[0]._0_4_;
      iVar24 = GStack_d00.super_CoordSys.offset[2]._4_4_;
      pAVar21 = local_d08;
      flag_01 = nrs_00;
      iVar25 = GStack_d00.super_CoordSys.offset[0]._0_4_;
      alpha_01 = ccent_00;
      nbhd_vol_00 = local_5b8;
      iVar26 = local_5b0;
      lev_geom_01 = ccent_00;
      amrex::Array4<double>::Array4
                (&local_f80,(double *)local_d08,(Dim3 *)&stack0xfffffffffffffa68,(Dim3 *)&local_5b8,
                 GStack_d00.super_CoordSys.offset[2]._4_4_);
      local_1c8 = &GStack_d00;
      local_174 = 0;
      local_184 = 1;
      local_194 = 2;
      local_120 = (undefined1 *)((long)GStack_d00.super_CoordSys.offset + 4);
      local_124 = 0;
      local_150 = GStack_d00.super_CoordSys.offset[0]._4_4_ + 1;
      local_130 = (undefined1 *)((long)GStack_d00.super_CoordSys.offset + 4);
      local_134 = 1;
      iStack_14c = GStack_d00.super_CoordSys.offset[1]._0_4_ + 1;
      local_140 = (undefined1 *)((long)GStack_d00.super_CoordSys.offset + 4);
      local_144 = 2;
      local_208.z = GStack_d00.super_CoordSys.offset[1]._4_4_ + 1;
      local_208.y = iStack_14c;
      local_208.x = local_150;
      local_1f8[0]._0_8_ = local_208._0_8_;
      local_1f8[0].z = local_208.z;
      local_1a8 = local_1c8;
      local_190 = local_1c8;
      local_180 = local_1c8;
      local_170 = local_1c8;
      local_168._0_8_ = local_208._0_8_;
      local_168.z = local_208.z;
      local_158 = local_1c8;
      local_148 = local_208.z;
      amrex::Array4<const_double>::Array4
                (&local_fc0,(double *)local_d08,&local_1d8,local_1f8,
                 GStack_d00.super_CoordSys.offset[2]._4_4_);
      amrex::BaseFab<double>::elixir<double,_0>(in_stack_ffffffffffffea98);
      local_498 = auStack_d48;
      local_444 = 0;
      local_454 = 1;
      local_464 = 2;
      local_3f0 = &iStack_d3c;
      local_3f4 = 0;
      local_420 = iStack_d3c + 1;
      local_400 = &iStack_d3c;
      local_404 = 1;
      iStack_41c = local_d38 + 1;
      local_410 = &iStack_d3c;
      local_414 = 2;
      local_4c8[0].z = iStack_d34 + 1;
      local_4c8[0].y = iStack_41c;
      local_4c8[0].x = local_420;
      local_478 = local_498;
      local_460 = local_498;
      local_450 = local_498;
      local_440 = local_498;
      local_438._0_8_ = local_4c8[0]._0_8_;
      local_438.z = local_4c8[0].z;
      local_428 = local_498;
      local_418 = local_4c8[0].z;
      amrex::Array4<double>::Array4(&local_1018,local_d50,&local_4a8,local_4c8,local_d2c);
      local_d8 = auStack_d48;
      local_84 = 0;
      local_94 = 1;
      local_a4 = 2;
      local_30 = &iStack_d3c;
      local_34 = 0;
      local_60 = iStack_d3c + 1;
      local_40 = &iStack_d3c;
      local_44 = 1;
      iStack_5c = local_d38 + 1;
      local_50 = &iStack_d3c;
      local_54 = 2;
      local_118.z = iStack_d34 + 1;
      local_118.y = iStack_5c;
      local_118.x = local_60;
      local_104[0]._0_8_ = local_118._0_8_;
      local_104[0].z = local_118.z;
      local_b8 = local_d8;
      local_a0 = local_d8;
      local_90 = local_d8;
      local_80 = local_d8;
      local_78._0_8_ = local_118._0_8_;
      local_78.z = local_118.z;
      local_68 = local_d8;
      local_58 = local_118.z;
      amrex::Array4<const_double>::Array4
                ((Array4<const_double> *)&stack0xffffffffffffefa8,local_d50,&local_e8,local_104,
                 local_d2c);
      pBVar6 = amrex::Geometry::Domain(in_stack_00000058);
      uVar1 = *(undefined8 *)(pBVar6->smallend).vect;
      iVar8 = (int)uVar1;
      iVar9 = (int)((ulong)uVar1 >> 0x20);
      uVar1 = *(undefined8 *)((pBVar6->smallend).vect + 2);
      iVar10 = (int)uVar1;
      iVar11 = (int)((ulong)uVar1 >> 0x20);
      uVar1 = *(undefined8 *)((pBVar6->bigend).vect + 1);
      iVar12 = (int)uVar1;
      iVar13 = (int)((ulong)uVar1 >> 0x20);
      IVar14.itype = (pBVar6->btype).itype;
      bVar4 = amrex::Geometry::isPeriodic(in_stack_00000058,0);
      if (bVar4) {
        amrex::Box::grow((Box *)&stack0xffffffffffffef8c,0,1);
      }
      bVar4 = amrex::Geometry::isPeriodic(in_stack_00000058,1);
      if (bVar4) {
        amrex::Box::grow((Box *)&stack0xffffffffffffef8c,1,1);
      }
      bVar4 = amrex::Geometry::isPeriodic(in_stack_00000058,2);
      if (bVar4) {
        amrex::Box::grow((Box *)&stack0xffffffffffffef8c,2,1);
      }
      bVar4 = amrex::Box::contains((Box *)&stack0xffffffffffffef8c,local_b30);
      if (!bVar4) {
        local_10d8 = CONCAT44(iVar9,iVar8);
        local_10d0 = CONCAT44(iVar11,iVar10);
        local_10c8 = CONCAT44(iVar13,iVar12);
        local_10c0 = IVar14.itype;
        memcpy(auStack_10b8,local_a40,0x3c);
        amrex::
        ParallelFor<int,Redistribution::Apply(amrex::Box_const&,int,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::BCRec_const*,amrex::Geometry_const&,double,std::__cxx11::string,int,double,amrex::Array4<double_const>const&)::__1,void>
                  ((Box *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar7,
                   (anon_class_96_2_b6e3bc06 *)in_stack_ffffffffffffeab0);
      }
      amrex::Box::Box<double>((Box *)in_stack_ffffffffffffea70,in_stack_ffffffffffffea68);
      local_1208 = *in_stack_00000070;
      uStack_1200 = in_stack_00000070[1];
      local_11f8 = in_stack_00000070[2];
      uStack_11f0 = in_stack_00000070[3];
      uStack_11e8 = in_stack_00000070[4];
      uStack_11d4 = *(undefined8 *)((long)in_stack_00000070 + 0x34);
      uStack_11d8 = (undefined4)((ulong)*(undefined8 *)((long)in_stack_00000070 + 0x2c) >> 0x20);
      uStack_11e0 = (undefined4)in_stack_00000070[5];
      local_11dc = (undefined4)((ulong)in_stack_00000070[5] >> 0x20);
      local_11c8 = local_a50->p;
      LStack_11c0 = local_a50->jstride;
      local_11b8 = local_a50->kstride;
      LStack_11b0 = local_a50->nstride;
      uStack_11a8._0_4_ = (local_a50->begin).x;
      uStack_11a8._4_4_ = (local_a50->begin).y;
      uVar1 = *(undefined8 *)&(local_a50->begin).z;
      uVar2 = (local_a50->end).y;
      uStack_1194 = *(undefined8 *)&(local_a50->end).z;
      uStack_11a0 = (undefined4)uVar1;
      local_119c = (undefined4)((ulong)uVar1 >> 0x20);
      local_1188 = *local_a48;
      uStack_1180 = local_a48[1];
      local_1178 = local_a48[2];
      uStack_1170 = local_a48[3];
      uStack_1168 = local_a48[4];
      uStack_1154 = *(undefined8 *)((long)local_a48 + 0x34);
      uStack_1158 = (undefined4)((ulong)*(undefined8 *)((long)local_a48 + 0x2c) >> 0x20);
      uStack_1160 = (undefined4)local_a48[5];
      local_115c = (undefined4)((ulong)local_a48[5] >> 0x20);
      local_1148 = local_a58;
      local_1140 = local_a40->p;
      LStack_1138 = local_a40->jstride;
      local_1130 = local_a40->kstride;
      LStack_1128 = local_a40->nstride;
      uStack_1120._0_4_ = (local_a40->begin).x;
      uStack_1120._4_4_ = (local_a40->begin).y;
      uVar1 = *(undefined8 *)&(local_a40->begin).z;
      uVar3 = (local_a40->end).y;
      uStack_110c = *(undefined8 *)&(local_a40->end).z;
      uStack_1118 = (undefined4)uVar1;
      local_1114 = (undefined4)((ulong)uVar1 >> 0x20);
      uStack_1198 = uVar2;
      uStack_1110 = uVar3;
      amrex::
      ParallelFor<int,Redistribution::Apply(amrex::Box_const&,int,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::BCRec_const*,amrex::Geometry_const&,double,std::__cxx11::string,int,double,amrex::Array4<double_const>const&)::__2,void>
                ((Box *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar7,
                 in_stack_ffffffffffffeab0);
      MakeITracker((Box *)CONCAT44(IVar14.itype,iVar13),
                   (Array4<const_double> *)CONCAT44(iVar12,iVar11),
                   (Array4<const_double> *)CONCAT44(iVar10,iVar9),
                   (Array4<const_double> *)CONCAT44(iVar8,in_stack_ffffffffffffef88),
                   in_stack_ffffffffffffef80,(Array4<int> *)in_stack_ffffffffffffef78,
                   in_stack_ffffffffffffefc0,(Real)in_stack_ffffffffffffef70);
      amrex::Array4<const_int>::Array4<const_int,_0>(&local_1248,&local_db8);
      MakeStateRedistUtils
                ((Box *)CONCAT44(in_stack_fffffffffffffa94,iVar25),flag_01,pAVar21,
                 (Array4<const_double> *)ccent_00,(Array4<const_int> *)CONCAT44(iVar24,iVar23),
                 (Array4<double> *)nrs_00,(Array4<double> *)alpha_01,nbhd_vol_00,
                 (Array4<double> *)CONCAT44(in_stack_fffffffffffffae4,iVar26),lev_geom_01,
                 (Real)CONCAT44(in_stack_fffffffffffffa64,iVar22));
      f = (anon_class_392_7_bf467b72 *)&stack0xffffffffffffefa8;
      StateRedistribute(bx_00,ncomp_00,(Array4<double> *)U_out,
                        (Array4<double> *)CONCAT44(uVar16,in_stack_fffffffffffff610),flag_00,
                        (Array4<const_double> *)CONCAT44(uVar15,in_stack_fffffffffffff600),fcx_00,
                        fcy_00,(Array4<const_double> *)CONCAT44(in_stack_fffffffffffff774,iVar5),
                        ccent,(BCRec *)CONCAT44(in_stack_fffffffffffff784,iVar17),
                        (Array4<const_int> *)itracker_00,
                        (Array4<const_double> *)CONCAT44(in_stack_fffffffffffff794,iVar18),alpha_00,
                        (Array4<const_double> *)CONCAT44(iVar20,iVar19),cent_hat_00,lev_geom_00,
                        max_order);
      iVar7 = (int)((ulong)in_stack_00000058 >> 0x20);
      memcpy(local_13d0,&local_db8,0x3c);
      memcpy(auStack_1390,&local_e50,0x3c);
      memcpy(auStack_1350,in_stack_00000070,0x3c);
      memcpy(auStack_1310,local_a38,0x3c);
      memcpy(auStack_12d0,local_a48,0x3c);
      local_1290 = local_a58;
      memcpy(auStack_1288,local_a40,0x3c);
      amrex::
      ParallelFor<int,Redistribution::Apply(amrex::Box_const&,int,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::BCRec_const*,amrex::Geometry_const&,double,std::__cxx11::string,int,double,amrex::Array4<double_const>const&)::__3,void>
                ((Box *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_00000068),iVar7,f);
      amrex::Gpu::Elixir::~Elixir(in_stack_00000038);
      amrex::Gpu::Elixir::~Elixir(in_stack_00000038);
      amrex::Gpu::Elixir::~Elixir(in_stack_00000038);
      amrex::Gpu::Elixir::~Elixir(in_stack_00000038);
      amrex::Gpu::Elixir::~Elixir(in_stack_00000038);
      amrex::FArrayBox::~FArrayBox((FArrayBox *)0x9ffeb0);
      amrex::FArrayBox::~FArrayBox((FArrayBox *)0x9ffebd);
      amrex::FArrayBox::~FArrayBox((FArrayBox *)0x9ffeca);
      amrex::FArrayBox::~FArrayBox((FArrayBox *)0x9ffed7);
      amrex::IArrayBox::~IArrayBox((IArrayBox *)0x9ffee4);
    }
    else {
      bVar4 = std::operator==(in_stack_ffffffffffffea70,(char *)in_stack_ffffffffffffea68);
      if (bVar4) {
        memcpy(local_1450,local_a38,0x3c);
        memcpy(auStack_1410,local_a40,0x3c);
        amrex::
        ParallelFor<int,Redistribution::Apply(amrex::Box_const&,int,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::BCRec_const*,amrex::Geometry_const&,double,std::__cxx11::string,int,double,amrex::Array4<double_const>const&)::__4,void>
                  ((Box *)CONCAT44(in_stack_ffffffffffffeac4,in_stack_ffffffffffffeac0),iVar7,
                   (anon_class_128_2_889a7212 *)in_stack_ffffffffffffeab0);
      }
      else {
        amrex::Error_host((char *)in_stack_ffffffffffffea80);
      }
    }
  }
  return;
}

Assistant:

void Redistribution::Apply ( Box const& bx, int ncomp,
                             Array4<Real      > const& dUdt_out,
                             Array4<Real      > const& dUdt_in,
                             Array4<Real const> const& U_in,
                             Array4<Real> const& scratch,
                             Array4<EBCellFlag const> const& flag,
                             AMREX_D_DECL(Array4<Real const> const& apx,
                                          Array4<Real const> const& apy,
                                          Array4<Real const> const& apz),
                             Array4<amrex::Real const> const& vfrac,
                             AMREX_D_DECL(Array4<Real const> const& fcx,
                                          Array4<Real const> const& fcy,
                                          Array4<Real const> const& fcz),
                             Array4<Real const> const& ccc,
                             amrex::BCRec  const* d_bcrec_ptr,
                             Geometry const& lev_geom, Real dt,
                             std::string redistribution_type,
                             const int srd_max_order,
                             amrex::Real target_volfrac,
                             Array4<Real const> const& srd_update_scale)
{
    // redistribution_type = "NoRedist";       // no redistribution
    // redistribution_type = "FluxRedist"      // flux_redistribute
    // redistribution_type = "StateRedist";    // (weighted) state redistribute

    amrex::ParallelFor(bx,ncomp,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            dUdt_out(i,j,k,n) = 0.;
        });

    if (redistribution_type == "FluxRedist")
    {
        int icomp = 0;
        apply_flux_redistribution (bx, dUdt_out, dUdt_in, scratch, icomp, ncomp, flag, vfrac, lev_geom);

    } else if (redistribution_type == "StateRedist") {

        Box const& bxg1 = grow(bx,1);
        Box const& bxg2 = grow(bx,2);
        Box const& bxg3 = grow(bx,3);
        Box const& bxg4 = grow(bx,4);

#if (AMREX_SPACEDIM == 2)
        // We assume that in 2D a cell will only need at most 3 neighbors to merge with, and we
        //    use the first component of this for the number of neighbors
        IArrayBox itracker(bxg4,4);
        // How many nbhds is a cell in
#else
        // We assume that in 3D a cell will only need at most 7 neighbors to merge with, and we
        //    use the first component of this for the number of neighbors
        IArrayBox itracker(bxg4,8);
#endif
        FArrayBox nrs_fab(bxg3,1);
        FArrayBox alpha_fab(bxg3,2);

        // Total volume of all cells in my nbhd
        FArrayBox nbhd_vol_fab(bxg2,1);

        // Centroid of my nbhd
        FArrayBox cent_hat_fab     (bxg3,AMREX_SPACEDIM);

        Elixir eli_itr = itracker.elixir();
        Array4<int> itr = itracker.array();
        Array4<int const> itr_const = itracker.const_array();

        Elixir eli_nrs = nrs_fab.elixir();
        Array4<Real      > nrs       = nrs_fab.array();
        Array4<Real const> nrs_const = nrs_fab.const_array();

        Elixir eli_alpha = alpha_fab.elixir();
        Array4<Real      > alpha       = alpha_fab.array();
        Array4<Real const> alpha_const = alpha_fab.const_array();

        Elixir eli_nbf = nbhd_vol_fab.elixir();
        Array4<Real      > nbhd_vol       = nbhd_vol_fab.array();
        Array4<Real const> nbhd_vol_const = nbhd_vol_fab.const_array();

        Elixir eli_chf = cent_hat_fab.elixir();
        Array4<Real      > cent_hat       = cent_hat_fab.array();
        Array4<Real const> cent_hat_const = cent_hat_fab.const_array();

        Box domain_per_grown = lev_geom.Domain();
        AMREX_D_TERM(if (lev_geom.isPeriodic(0)) domain_per_grown.grow(0,1);,
                     if (lev_geom.isPeriodic(1)) domain_per_grown.grow(1,1);,
                     if (lev_geom.isPeriodic(2)) domain_per_grown.grow(2,1););

        // At any external Dirichlet domain boundaries we need to set dUdt_in to 0
        //    in the cells just outside the domain because those values will be used
        //    in the slope computation in state redistribution.  We assume here that
        //    the ext_dir values of U_in itself have already been set.
        if (!domain_per_grown.contains(bxg1))
            amrex::ParallelFor(bxg1,ncomp,
            [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                {
                    if (!domain_per_grown.contains(IntVect(AMREX_D_DECL(i,j,k))))
                        dUdt_in(i,j,k,n) = 0.;
                });

        amrex::ParallelFor(Box(scratch), ncomp,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                const Real scale = (srd_update_scale) ? srd_update_scale(i,j,k) : Real(1.0);
                scratch(i,j,k,n) = U_in(i,j,k,n) + dt * dUdt_in(i,j,k,n) / scale;
            }
        );

        MakeITracker(bx, AMREX_D_DECL(apx, apy, apz), vfrac, itr, lev_geom, target_volfrac);

        MakeStateRedistUtils(bx, flag, vfrac, ccc, itr, nrs, alpha, nbhd_vol, cent_hat,
                             lev_geom, target_volfrac);

        StateRedistribute(bx, ncomp, dUdt_out, scratch, flag, vfrac,
                          AMREX_D_DECL(fcx, fcy, fcz), ccc,  d_bcrec_ptr,
                          itr_const, nrs_const, alpha_const, nbhd_vol_const,
                          cent_hat_const, lev_geom, srd_max_order);

        amrex::ParallelFor(bx, ncomp,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                // Only update the values which actually changed -- this makes
                // the results insensitive to tiling -- otherwise cells that aren't
                // changed but are in a tile on which StateRedistribute gets called
                // will have precision-level changes due to adding/subtracting U_in
                // and multiplying/dividing by dt.   Here we test on whether (i,j,k)
                // has at least one neighbor and/or whether (i,j,k) is in the
                // neighborhood of another cell -- if either of those is true the
                // value may have changed

                if (itr(i,j,k,0) > 0 || nrs(i,j,k) > 1.)
                {
                   const Real scale = (srd_update_scale) ? srd_update_scale(i,j,k) : Real(1.0);

                   dUdt_out(i,j,k,n) = scale * (dUdt_out(i,j,k,n) - U_in(i,j,k,n)) / dt;

                }
                else
                {
                   dUdt_out(i,j,k,n) = dUdt_in(i,j,k,n);
                }
            }
        );

    } else if (redistribution_type == "NoRedist") {
        amrex::ParallelFor(bx, ncomp,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                dUdt_out(i,j,k,n) = dUdt_in(i,j,k,n);
            }
        );

    } else {
       amrex::Error("Not a legit redist_type");
    }
}